

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DerTypes.h
# Opt level: O0

bool __thiscall AnyType::OutputFromType<PrintableString>(AnyType *this,ostream *os)

{
  bool bVar1;
  undefined1 local_48 [7];
  bool fConverted;
  PrintableString t;
  ostream *os_local;
  AnyType *this_local;
  
  t.value.field_2._8_8_ = os;
  PrintableString::PrintableString((PrintableString *)local_48);
  bVar1 = ConvertToType<PrintableString>(this,(PrintableString *)local_48);
  if (bVar1) {
    ::operator<<((ostream *)t.value.field_2._8_8_,(PrintableString *)local_48);
  }
  PrintableString::~PrintableString((PrintableString *)local_48);
  return bVar1;
}

Assistant:

bool OutputFromType(std::ostream& os) const 
    {
        T t;
        bool fConverted = ConvertToType(t);
        if (fConverted)
            os << t;

        return fConverted;
    }